

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

word Ifd_ObjTruth_rec(Ifd_Man_t *p,int iLit,int *pCounter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Ifd_Obj_t *pIVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = Abc_LitIsCompl(iLit);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0xe9,"word Ifd_ObjTruth_rec(Ifd_Man_t *, int, int *)");
  }
  if (iLit == 2) {
    iVar1 = *pCounter;
    *pCounter = iVar1 + 1;
    wVar5 = Ifd_ObjTruth_rec::s_Truths6[iVar1];
  }
  else {
    pIVar4 = Ifd_ManObjFromLit(p,iLit);
    iVar1 = Abc_LitRegular(pIVar4->pFans[0]);
    wVar5 = Ifd_ObjTruth_rec(p,iVar1,pCounter);
    iVar1 = Abc_LitRegular(pIVar4->pFans[1]);
    wVar6 = Ifd_ObjTruth_rec(p,iVar1,pCounter);
    if (pIVar4->pFans[2] == 0xffffffff) {
      wVar7 = 0;
    }
    else {
      iVar1 = Abc_LitRegular(pIVar4->pFans[2]);
      wVar7 = Ifd_ObjTruth_rec(p,iVar1,pCounter);
    }
    iVar1 = Abc_LitIsCompl(pIVar4->pFans[0]);
    iVar2 = Abc_LitIsCompl(pIVar4->pFans[1]);
    if (pIVar4->pFans[2] != 0xffffffff) {
      iVar3 = Abc_LitIsCompl(pIVar4->pFans[2]);
      wVar7 = wVar7 ^ (long)-iVar3;
    }
    uVar9 = wVar5 ^ (long)-iVar1;
    uVar8 = wVar6 ^ (long)-iVar2;
    switch(*(uint *)pIVar4 >> 0x1d & 3) {
    case 0:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                    ,0xfe,"word Ifd_ObjTruth_rec(Ifd_Man_t *, int, int *)");
    case 1:
      wVar5 = uVar8 & uVar9;
      break;
    case 3:
      uVar8 = (uVar8 ^ uVar9) & wVar7;
    case 2:
      wVar5 = uVar8 ^ uVar9;
    }
  }
  return wVar5;
}

Assistant:

word Ifd_ObjTruth_rec( Ifd_Man_t * p, int iLit, int * pCounter )
{
    static word s_Truths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Ifd_Obj_t * pDsd;
    word Fun0, Fun1, Fun2 = 0;
    assert( !Abc_LitIsCompl(iLit) );
    if ( iLit == 2 )
        return s_Truths6[(*pCounter)++];
    pDsd = Ifd_ManObjFromLit( p, iLit );

    Fun0 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[0]), pCounter );
    Fun1 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[1]), pCounter );
    if ( pDsd->pFans[2] != -1 )
    Fun2 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[2]), pCounter );

    Fun0 = Abc_LitIsCompl(pDsd->pFans[0]) ? ~Fun0 : Fun0;
    Fun1 = Abc_LitIsCompl(pDsd->pFans[1]) ? ~Fun1 : Fun1;
    if ( pDsd->pFans[2] != -1 )
    Fun2 = Abc_LitIsCompl(pDsd->pFans[2]) ? ~Fun2 : Fun2;

    if ( pDsd->Type == 1 )
        return Fun0 & Fun1;
    if ( pDsd->Type == 2 )
        return Fun0 ^ Fun1;
    if ( pDsd->Type == 3 )
        return (Fun2 & Fun1) | (~Fun2 & Fun0);
    assert( 0 );
    return -1;
}